

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O0

void ImPlot::PlotErrorBarsEx<ImPlot::GetterError<signed_char>>
               (char *label_id,GetterError<signed_char> *getter)

{
  float fVar1;
  bool bVar2;
  ImU32 col_00;
  ImPlotNextItemData *pIVar3;
  ImDrawList *this;
  float _x;
  ImVec2 local_f0;
  ImVec2 local_e8;
  ImVec2 local_e0;
  ImVec2 local_d8;
  ImVec2 local_d0;
  ImVec2 local_c8;
  ImVec2 local_c0;
  ImVec2 local_b8;
  ImVec2 local_b0;
  ImVec2 p2;
  ImVec2 p1;
  ImPlotPointError e_1;
  int i_1;
  float half_whisker;
  bool rend_whisker;
  ImU32 col;
  ImDrawList *DrawList;
  ImPlotNextItemData *s;
  ImPlotPoint local_50;
  undefined1 local_40 [8];
  ImPlotPointError e;
  int i;
  GetterError<signed_char> *getter_local;
  char *label_id_local;
  
  bVar2 = BeginItem(label_id,-1);
  if (bVar2) {
    bVar2 = FitThisFrame();
    if (bVar2) {
      for (e.Pos._4_4_ = 0; e.Pos._4_4_ < getter->Count; e.Pos._4_4_ = e.Pos._4_4_ + 1) {
        GetterError<signed_char>::operator()((ImPlotPointError *)local_40,getter,e.Pos._4_4_);
        ImPlotPoint::ImPlotPoint(&local_50,(double)local_40,e.X - e.Y);
        FitPoint(&local_50);
        ImPlotPoint::ImPlotPoint((ImPlotPoint *)&s,(double)local_40,e.X + e.Neg);
        FitPoint((ImPlotPoint *)&s);
      }
    }
    pIVar3 = GetItemData();
    this = GetPlotDrawList();
    col_00 = ImGui::GetColorU32(pIVar3->Colors + 4);
    fVar1 = pIVar3->ErrorBarSize;
    _x = pIVar3->ErrorBarSize * 0.5;
    for (e_1.Pos._0_4_ = 0; e_1.Pos._0_4_ < getter->Count; e_1.Pos._0_4_ = e_1.Pos._0_4_ + 1) {
      GetterError<signed_char>::operator()((ImPlotPointError *)&p1,getter,e_1.Pos._0_4_);
      p2 = PlotToPixels((double)p1,e_1.X - e_1.Y,-1);
      local_b0 = PlotToPixels((double)p1,e_1.X + e_1.Neg,-1);
      ImDrawList::AddLine(this,&p2,&local_b0,col_00,pIVar3->ErrorBarWeight);
      if (0.0 < fVar1) {
        ImVec2::ImVec2(&local_c0,_x,0.0);
        local_b8 = ::operator-(&p2,&local_c0);
        ImVec2::ImVec2(&local_d0,_x,0.0);
        local_c8 = ::operator+(&p2,&local_d0);
        ImDrawList::AddLine(this,&local_b8,&local_c8,col_00,pIVar3->ErrorBarWeight);
        ImVec2::ImVec2(&local_e0,_x,0.0);
        local_d8 = ::operator-(&local_b0,&local_e0);
        ImVec2::ImVec2(&local_f0,_x,0.0);
        local_e8 = ::operator+(&local_b0,&local_f0);
        ImDrawList::AddLine(this,&local_d8,&local_e8,col_00,pIVar3->ErrorBarWeight);
      }
    }
    EndItem();
  }
  return;
}

Assistant:

void PlotErrorBarsEx(const char* label_id, const Getter& getter) {
    if (BeginItem(label_id)) {
        if (FitThisFrame()) {
            for (int i = 0; i < getter.Count; ++i) {
                ImPlotPointError e = getter(i);
                FitPoint(ImPlotPoint(e.X , e.Y - e.Neg));
                FitPoint(ImPlotPoint(e.X , e.Y + e.Pos ));
            }
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList& DrawList = *GetPlotDrawList();
        const ImU32 col = ImGui::GetColorU32(s.Colors[ImPlotCol_ErrorBar]);
        const bool rend_whisker  = s.ErrorBarSize > 0;
        const float half_whisker = s.ErrorBarSize * 0.5f;
        for (int i = 0; i < getter.Count; ++i) {
            ImPlotPointError e = getter(i);
            ImVec2 p1 = PlotToPixels(e.X, e.Y - e.Neg);
            ImVec2 p2 = PlotToPixels(e.X, e.Y + e.Pos);
            DrawList.AddLine(p1,p2,col, s.ErrorBarWeight);
            if (rend_whisker) {
                DrawList.AddLine(p1 - ImVec2(half_whisker, 0), p1 + ImVec2(half_whisker, 0), col, s.ErrorBarWeight);
                DrawList.AddLine(p2 - ImVec2(half_whisker, 0), p2 + ImVec2(half_whisker, 0), col, s.ErrorBarWeight);
            }
        }
        EndItem();
    }
}